

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int archive_read_format_rar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  CPpmd7 *p;
  IPpmd7_RangeDec *rc;
  rar_br *br;
  int *piVar1;
  byte bVar2;
  byte bVar3;
  void *pvVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  void *pvVar14;
  long lVar15;
  uchar *puVar16;
  uLong uVar17;
  int iVar18;
  char *pcVar19;
  uint uVar20;
  ulong uVar21;
  void *pvVar22;
  void *__dest;
  unsigned_long crc;
  uint uVar23;
  long lVar24;
  byte *pbVar25;
  uint uVar26;
  ulong uVar27;
  size_t local_38;
  
  pvVar4 = a->format->data;
  if (*(int *)((long)pvVar4 + 0x4f10) == -1) {
    *(undefined4 *)((long)pvVar4 + 0x4f10) = 0;
  }
  if (0 < *(long *)((long)pvVar4 + 0xa0)) {
    __archive_read_consume(a,*(long *)((long)pvVar4 + 0xa0));
    *(undefined8 *)((long)pvVar4 + 0xa0) = 0;
  }
  *buff = (void *)0x0;
  if ((*(char *)((long)pvVar4 + 0xed) == '\0') &&
     (*(long *)((long)pvVar4 + 200) < *(long *)((long)pvVar4 + 0x28))) {
    if (*(byte *)((long)pvVar4 + 0x17) - 0x31 < 5) {
LAB_00576ca4:
      pbVar25 = (byte *)a->format->data;
      p = (CPpmd7 *)(pbVar25 + 0x398);
      rc = (IPpmd7_RangeDec *)(pbVar25 + 0x4e88);
      uVar27 = 0;
      do {
        if (pbVar25[0xd0] == 0) {
LAB_005778b4:
          iVar7 = -0x1e;
          goto LAB_005778b9;
        }
        if (pbVar25[0x392] != 0) {
LAB_005778e1:
          uVar6 = *(uint *)(pbVar25 + 0xd4);
          if ((ulong)uVar6 != 0) {
            puVar16 = *(uchar **)(pbVar25 + 0xe0);
            *buff = puVar16;
            *size = (ulong)uVar6;
            lVar15 = *(long *)(pbVar25 + 0xc0);
            *offset = lVar15;
            *(size_t *)(pbVar25 + 0xc0) = lVar15 + *size;
            uVar17 = cm_zlib_crc32(*(unsigned_long *)(pbVar25 + 0xf0),puVar16,(uint)*size);
            *(uLong *)(pbVar25 + 0xf0) = uVar17;
            pbVar25[0xd4] = 0;
            pbVar25[0xd5] = 0;
            pbVar25[0xd6] = 0;
            pbVar25[0xd7] = 0;
            return 0;
          }
          *buff = (void *)0x0;
          *size = 0;
          *offset = *(int64_t *)(pbVar25 + 0xb8);
          if (*(long *)(pbVar25 + 8) == *(long *)(pbVar25 + 0xf0)) {
            pbVar25[0xed] = 1;
            iVar7 = 1;
            goto LAB_005778b9;
          }
          pcVar19 = "File CRC error";
LAB_005778a5:
          archive_set_error(&a->archive,0x54,pcVar19);
          goto LAB_005778b4;
        }
        if (*(int *)(pbVar25 + 0xe8) != 0) {
          if (*(long *)(pbVar25 + 0x28) <= *(long *)(pbVar25 + 0xb8)) goto LAB_005778e1;
          if ((pbVar25[0x393] != 0) || (uVar21 = *(ulong *)(pbVar25 + 0xb0), (long)uVar21 < 1))
          goto LAB_00576d2d;
          uVar27 = (ulong)(uint)(*(int *)(pbVar25 + 0xd8) - *(int *)(pbVar25 + 0xd4));
          if (uVar21 < (uint)(*(int *)(pbVar25 + 0xd8) - *(int *)(pbVar25 + 0xd4))) {
            uVar27 = uVar21;
          }
          uVar6 = copy_from_lzss_window(a,buff,*(long *)(pbVar25 + 0xb8),(int)uVar27);
          if (uVar6 != 0) {
LAB_005779ca:
            uVar27 = (ulong)uVar6;
            goto LAB_005779cd;
          }
          *(ulong *)(pbVar25 + 0xb8) = *(long *)(pbVar25 + 0xb8) + uVar27;
          *(ulong *)(pbVar25 + 0xb0) = *(long *)(pbVar25 + 0xb0) - uVar27;
          puVar16 = (uchar *)*buff;
          if (puVar16 == (uchar *)0x0) {
            puVar16 = (uchar *)0x0;
            uVar27 = 0;
            goto LAB_0057779b;
          }
          pbVar25[0xd4] = 0;
          pbVar25[0xd5] = 0;
          pbVar25[0xd6] = 0;
          pbVar25[0xd7] = 0;
          *size = (ulong)*(uint *)(pbVar25 + 0xd8);
          lVar15 = *(long *)(pbVar25 + 0xc0);
          *offset = lVar15;
          *(size_t *)(pbVar25 + 0xc0) = lVar15 + *size;
          crc = *(unsigned_long *)(pbVar25 + 0xf0);
          local_38 = (size_t)(uint)*size;
          goto LAB_00577881;
        }
LAB_00576d2d:
        if ((*(long *)(pbVar25 + 0x4f08) == 0) &&
           (uVar27 = 0, 0 < *(long *)((long)a->format->data + 0xa8))) {
          pvVar14 = rar_read_ahead(a,1,(ssize_t *)(pbVar25 + 0x4f00));
          *(void **)(pbVar25 + 0x4f08) = pvVar14;
          if (pvVar14 == (void *)0x0) {
            pcVar19 = "Truncated RAR file data";
            goto LAB_005778a5;
          }
          if (*(int *)(pbVar25 + 0x4ef8) == 0) {
            rar_br_fillup(a,(rar_br *)(pbVar25 + 0x4ef0));
          }
        }
        if (pbVar25[0x390] != 0) {
          uVar6 = parse_codes(a);
          uVar27 = (ulong)uVar6;
          if (-0x15 < (int)uVar6) goto LAB_00576d59;
          goto LAB_005779cd;
        }
LAB_00576d59:
        if (pbVar25[0x393] == 0) {
          lVar15 = *(long *)(pbVar25 + 0xb8);
          lVar24 = (ulong)*(uint *)(pbVar25 + 0xe8) + lVar15;
          pbVar25[0x388] = 0xff;
          pbVar25[0x389] = 0xff;
          pbVar25[0x38a] = 0xff;
          pbVar25[0x38b] = 0xff;
          pbVar25[0x38c] = 0xff;
          pbVar25[0x38d] = 0xff;
          pbVar25[0x38e] = 0xff;
          pbVar25[0x38f] = 0x7f;
          pvVar14 = a->format->data;
          br = (rar_br *)((long)pvVar14 + 0x4ef0);
          if (*(long *)((long)pvVar14 + 0x388) < lVar24) {
            lVar24 = *(long *)((long)pvVar14 + 0x388);
          }
          piVar1 = (int *)((long)pvVar14 + 0x36c);
LAB_00576ed3:
          while( true ) {
            uVar27 = *(ulong *)((long)pvVar14 + 0x358);
            if (*(char *)((long)pvVar14 + 0x360) != '\0') {
              uVar6 = *(uint *)((long)pvVar14 + 0x364);
              if (lVar24 < (long)(uVar27 + uVar6)) goto LAB_00577733;
              if (0 < (int)uVar6) {
                uVar10 = *(uint *)((long)pvVar14 + 0x350);
                uVar26 = (uint)uVar27 & uVar10;
                uVar20 = uVar26 - *(int *)((long)pvVar14 + 0x368) & uVar10;
                uVar13 = uVar6;
                do {
                  uVar9 = uVar20;
                  if ((int)uVar20 < (int)uVar26) {
                    uVar9 = uVar26;
                  }
                  uVar9 = (uVar10 - uVar9) + 1;
                  if ((int)uVar13 < (int)uVar9) {
                    uVar9 = uVar13;
                  }
                  __dest = (void *)((long)(int)uVar26 + *(long *)((long)pvVar14 + 0x348));
                  pvVar22 = (void *)(*(long *)((long)pvVar14 + 0x348) + (long)(int)uVar20);
                  if (((int)(uVar26 + uVar9) < (int)uVar20) || ((int)(uVar20 + uVar9) < (int)uVar26)
                     ) {
                    memcpy(__dest,pvVar22,(long)(int)uVar9);
                  }
                  else if (0 < (int)uVar9) {
                    uVar27 = 0;
                    do {
                      *(undefined1 *)((long)__dest + uVar27) =
                           *(undefined1 *)((long)pvVar22 + uVar27);
                      uVar27 = uVar27 + 1;
                    } while (uVar9 != uVar27);
                  }
                  uVar10 = *(uint *)((long)pvVar14 + 0x350);
                  uVar26 = uVar26 + uVar9 & uVar10;
                  uVar20 = uVar20 + uVar9 & uVar10;
                  uVar23 = uVar13 - uVar9;
                  bVar5 = (int)uVar9 <= (int)uVar13;
                  uVar13 = uVar23;
                } while (uVar23 != 0 && bVar5);
                uVar27 = *(ulong *)((long)pvVar14 + 0x358);
              }
              uVar27 = uVar27 + (long)(int)uVar6;
              *(ulong *)((long)pvVar14 + 0x358) = uVar27;
              *(undefined1 *)((long)pvVar14 + 0x360) = 0;
            }
            if ((*(char *)((long)pvVar14 + 0x393) != '\0') || (lVar24 <= (long)uVar27))
            goto LAB_00577733;
            uVar6 = read_next_symbol(a,(huffman_code *)((long)pvVar14 + 0x110));
            if ((int)uVar6 < 0) goto LAB_005778b4;
            *(undefined1 *)((long)pvVar14 + 0x360) = 0;
            if (0xff < uVar6) break;
            *(char *)(*(long *)((long)pvVar14 + 0x348) +
                     (long)(int)(*(uint *)((long)pvVar14 + 0x350) & *(uint *)((long)pvVar14 + 0x358)
                                )) = (char)uVar6;
            *(long *)((long)pvVar14 + 0x358) = *(long *)((long)pvVar14 + 0x358) + 1;
          }
          if (uVar6 != 0x100) {
            if (uVar6 == 0x102) goto LAB_0057712a;
            if (uVar6 == 0x101) goto switchD_00576dbb_caseD_3;
            if (0x106 < uVar6) {
              if (uVar6 < 0x10f) {
                bVar2 = *(byte *)((long)&expand_shortbases + (ulong)(uVar6 - 0x107));
                bVar3 = *(byte *)((long)&expand_shortbits + (ulong)(uVar6 - 0x107));
                iVar7 = *(int *)((long)pvVar14 + 0x4ef8);
                if (iVar7 < (int)(uint)bVar3) {
                  iVar8 = rar_br_fillup(a,br);
                  iVar7 = *(int *)((long)pvVar14 + 0x4ef8);
                  if ((iVar8 == 0) && (iVar7 < (int)(uint)bVar3)) goto LAB_00577a5c;
                }
                iVar7 = iVar7 - (uint)bVar3;
                iVar8 = ((uint)(*(ulong *)((long)pvVar14 + 0x4ef0) >> ((byte)iVar7 & 0x3f)) &
                        cache_masks[bVar3]) + bVar2 + 1;
                *(int *)((long)pvVar14 + 0x4ef8) = iVar7;
                *(undefined4 *)((long)pvVar14 + 0x378) = *(undefined4 *)((long)pvVar14 + 0x374);
                *(undefined8 *)((long)pvVar14 + 0x370) = *(undefined8 *)piVar1;
                *(int *)((long)pvVar14 + 0x36c) = iVar8;
                iVar7 = 2;
                goto LAB_0057743b;
              }
              if (uVar6 < 300) {
                uVar6 = uVar6 - 0x10f;
                iVar7 = (byte)expand_lengthbases[uVar6] + 3;
                if (7 < uVar6) {
                  bVar2 = expand_lengthbits[uVar6];
                  iVar8 = *(int *)((long)pvVar14 + 0x4ef8);
                  if (iVar8 < (int)(uint)bVar2) {
                    iVar18 = rar_br_fillup(a,br);
                    iVar8 = *(int *)((long)pvVar14 + 0x4ef8);
                    if ((iVar18 == 0) && (iVar8 < (int)(uint)bVar2)) goto LAB_00577a5c;
                  }
                  iVar8 = iVar8 - (uint)bVar2;
                  iVar7 = ((uint)(*(ulong *)((long)pvVar14 + 0x4ef0) >> ((byte)iVar8 & 0x3f)) &
                          cache_masks[bVar2]) + iVar7;
                  *(int *)((long)pvVar14 + 0x4ef8) = iVar8;
                }
                uVar6 = read_next_symbol(a,(huffman_code *)((long)pvVar14 + 0x138));
                if (uVar6 < 0x3d) {
                  uVar27 = (ulong)uVar6;
                  iVar8 = *(int *)(expand_offsetbases + uVar27 * 4) + 1;
                  if (3 < uVar6) {
                    bVar2 = expand_offsetbits[uVar27];
                    if (uVar6 < 10) {
                      iVar18 = *(int *)((long)pvVar14 + 0x4ef8);
                      if (iVar18 < (int)(uint)bVar2) {
                        iVar11 = rar_br_fillup(a,br);
                        iVar18 = *(int *)((long)pvVar14 + 0x4ef8);
                        if ((iVar11 == 0) && (iVar18 < (int)(uint)bVar2)) goto LAB_00577a5c;
                      }
                      iVar18 = iVar18 - (uint)bVar2;
                      iVar8 = ((uint)(*(ulong *)((long)pvVar14 + 0x4ef0) >> ((byte)iVar18 & 0x3f)) &
                              cache_masks[bVar2]) + iVar8;
                      *(int *)((long)pvVar14 + 0x4ef8) = iVar18;
                    }
                    else {
                      if (uVar27 - 0xc < 0x30) {
                        iVar18 = *(int *)((long)pvVar14 + 0x4ef8);
                        iVar11 = bVar2 - 4;
                        if (iVar18 < iVar11) {
                          iVar12 = rar_br_fillup(a,br);
                          iVar18 = *(int *)((long)pvVar14 + 0x4ef8);
                          if ((iVar12 == 0) && (iVar18 < iVar11)) goto LAB_00577a5c;
                        }
                        iVar8 = ((uint)(*(ulong *)((long)pvVar14 + 0x4ef0) >>
                                       ((byte)(iVar18 - iVar11) & 0x3f)) & (&UINT_0066d370)[bVar2])
                                * 0x10 + iVar8;
                        *(int *)((long)pvVar14 + 0x4ef8) = iVar18 - iVar11;
                      }
                      if (*(int *)((long)pvVar14 + 0x380) == 0) {
                        iVar18 = read_next_symbol(a,(huffman_code *)((long)pvVar14 + 0x160));
                        if (iVar18 < 0) goto LAB_005778b4;
                        if (iVar18 == 0x10) {
                          *(undefined4 *)((long)pvVar14 + 0x380) = 0xf;
                          iVar8 = iVar8 + *(int *)((long)pvVar14 + 0x37c);
                        }
                        else {
                          iVar8 = iVar8 + iVar18;
                          *(int *)((long)pvVar14 + 0x37c) = iVar18;
                        }
                      }
                      else {
                        *(int *)((long)pvVar14 + 0x380) = *(int *)((long)pvVar14 + 0x380) + -1;
                        iVar8 = iVar8 + *(int *)((long)pvVar14 + 0x37c);
                      }
                    }
                  }
                  *(undefined4 *)((long)pvVar14 + 0x378) = *(undefined4 *)((long)pvVar14 + 0x374);
                  *(undefined8 *)((long)pvVar14 + 0x370) = *(undefined8 *)piVar1;
                  iVar7 = iVar7 + (uint)(0x3ffff < iVar8) + (uint)(0x1fff < iVar8);
                  *piVar1 = iVar8;
                  goto LAB_0057743b;
                }
              }
LAB_00577a50:
              pcVar19 = "Bad RAR file data";
              goto LAB_005778a5;
            }
            iVar8 = piVar1[uVar6 - 0x103];
            uVar10 = read_next_symbol(a,(huffman_code *)((long)pvVar14 + 0x188));
            if (0x1c < uVar10) goto LAB_00577a50;
            iVar7 = (byte)expand_lengthbases[uVar10] + 2;
            if (7 < uVar10) {
              bVar2 = expand_lengthbits[uVar10];
              iVar18 = *(int *)((long)pvVar14 + 0x4ef8);
              if (iVar18 < (int)(uint)bVar2) {
                iVar11 = rar_br_fillup(a,br);
                iVar18 = *(int *)((long)pvVar14 + 0x4ef8);
                if ((iVar11 == 0) && (iVar18 < (int)(uint)bVar2)) goto LAB_00577a5c;
              }
              iVar18 = iVar18 - (uint)bVar2;
              iVar7 = ((uint)(*(ulong *)((long)pvVar14 + 0x4ef0) >> ((byte)iVar18 & 0x3f)) &
                      cache_masks[bVar2]) + iVar7;
              *(int *)((long)pvVar14 + 0x4ef8) = iVar18;
            }
            uVar27 = (ulong)(uVar6 - 0x103);
            if (0x103 < uVar6) {
              do {
                piVar1[uVar27] = *(int *)((long)pvVar14 + uVar27 * 4 + 0x368);
                bVar5 = 1 < uVar27;
                uVar27 = uVar27 - 1;
              } while (bVar5);
            }
            *piVar1 = iVar8;
            goto LAB_0057743b;
          }
          iVar7 = *(int *)((long)pvVar14 + 0x4ef8);
          if (iVar7 < 1) {
            iVar8 = rar_br_fillup(a,br);
            iVar7 = *(int *)((long)pvVar14 + 0x4ef8);
            if (iVar7 < 1 && iVar8 == 0) goto LAB_00577a5c;
          }
          uVar27 = *(ulong *)((long)pvVar14 + 0x4ef0);
          uVar6 = iVar7 - 1;
          *(uint *)((long)pvVar14 + 0x4ef8) = uVar6;
          if ((uVar27 >> ((ulong)uVar6 & 0x3f) & 1) != 0) {
            iVar7 = parse_codes(a);
            if (iVar7 != 0) goto LAB_005778b4;
            goto LAB_00576ed3;
          }
          *(undefined1 *)((long)pvVar14 + 0xec) = 1;
          if (iVar7 < 2) {
            iVar7 = rar_br_fillup(a,br);
            uVar6 = *(uint *)((long)pvVar14 + 0x4ef8);
            if ((int)uVar6 < 1 && iVar7 == 0) {
LAB_00577a5c:
              archive_set_error(&a->archive,0x54,"Truncated RAR file data");
              *(undefined1 *)((long)pvVar14 + 0xd0) = 0;
              goto LAB_005778b4;
            }
            uVar27 = br->cache_buffer;
          }
          *(bool *)((long)pvVar14 + 0x390) = (uVar27 >> ((ulong)(uVar6 - 1) & 0x3f) & 1) != 0;
          *(uint *)((long)pvVar14 + 0x4ef8) = uVar6 - 1;
          uVar27 = *(ulong *)((long)pvVar14 + 0x358);
LAB_00577733:
          if ((long)uVar27 < 0) goto LAB_005779cd;
          uVar27 = uVar27 - lVar15;
          *(ulong *)(pbVar25 + 0xb0) = uVar27;
          if (uVar27 == 0) {
            pcVar19 = "Internal error extracting RAR file";
            goto LAB_005778a5;
          }
        }
        else {
          iVar7 = Ppmd7_DecodeSymbol(p,rc);
          if (iVar7 < 0) {
LAB_0057789e:
            pcVar19 = "Invalid symbol";
            goto LAB_005778a5;
          }
          if (iVar7 == *(int *)(pbVar25 + 0x394)) {
            iVar8 = Ppmd7_DecodeSymbol(p,rc);
            if (iVar8 < 0) goto LAB_0057789e;
            switch(iVar8) {
            case 0:
              goto switchD_00576dbb_caseD_0;
            default:
              goto switchD_00576dbb_caseD_1;
            case 2:
              pbVar25[0x392] = 1;
              goto LAB_00577792;
            case 3:
switchD_00576dbb_caseD_3:
              archive_set_error(&a->archive,-1,"Parsing filters is unsupported.");
              iVar7 = -0x19;
              goto LAB_005778b9;
            case 4:
              uVar6 = 0;
              iVar7 = 0x10;
              do {
                iVar8 = Ppmd7_DecodeSymbol(p,rc);
                if (iVar8 < 0) goto LAB_0057789e;
                uVar6 = uVar6 | iVar8 << ((byte)iVar7 & 0x1f);
                iVar7 = iVar7 + -8;
              } while (iVar7 != -8);
              iVar7 = Ppmd7_DecodeSymbol(p,rc);
              if (iVar7 < 0) goto LAB_0057789e;
              uVar26 = iVar7 + 0x20;
              uVar10 = *(uint *)(pbVar25 + 0x350);
              uVar13 = *(uint *)(pbVar25 + 0x358) & uVar10;
              uVar20 = (uVar13 - uVar6) - 2 & uVar10;
              uVar6 = uVar26;
              do {
                uVar9 = uVar20;
                if ((int)uVar20 < (int)uVar13) {
                  uVar9 = uVar13;
                }
                uVar9 = (uVar10 - uVar9) + 1;
                if ((int)uVar6 < (int)uVar9) {
                  uVar9 = uVar6;
                }
                pvVar22 = (void *)((long)(int)uVar13 + *(long *)(pbVar25 + 0x348));
                pvVar14 = (void *)(*(long *)(pbVar25 + 0x348) + (long)(int)uVar20);
                if (((int)(uVar9 + uVar13) < (int)uVar20) || ((int)(uVar9 + uVar20) < (int)uVar13))
                {
                  memcpy(pvVar22,pvVar14,(long)(int)uVar9);
                }
                else if (0 < (int)uVar9) {
                  uVar27 = 0;
                  do {
                    *(undefined1 *)((long)pvVar22 + uVar27) =
                         *(undefined1 *)((long)pvVar14 + uVar27);
                    uVar27 = uVar27 + 1;
                  } while (uVar9 != uVar27);
                }
                uVar10 = *(uint *)(pbVar25 + 0x350);
                uVar13 = uVar9 + uVar13 & uVar10;
                uVar20 = uVar9 + uVar20 & uVar10;
                uVar23 = uVar6 - uVar9;
                bVar5 = (int)uVar9 <= (int)uVar6;
                uVar6 = uVar23;
              } while (uVar23 != 0 && bVar5);
              break;
            case 5:
              iVar7 = Ppmd7_DecodeSymbol(p,rc);
              if (iVar7 < 0) goto LAB_0057789e;
              uVar26 = iVar7 + 4;
              uVar6 = *(uint *)(pbVar25 + 0x350);
              uVar13 = *(uint *)(pbVar25 + 0x358) & uVar6;
              uVar20 = uVar13 - 1 & uVar6;
              uVar10 = uVar26;
              do {
                uVar9 = uVar20;
                if ((int)uVar20 < (int)uVar13) {
                  uVar9 = uVar13;
                }
                uVar9 = (uVar6 - uVar9) + 1;
                if ((int)uVar10 < (int)uVar9) {
                  uVar9 = uVar10;
                }
                pvVar22 = (void *)((long)(int)uVar13 + *(long *)(pbVar25 + 0x348));
                pvVar14 = (void *)(*(long *)(pbVar25 + 0x348) + (long)(int)uVar20);
                if (((int)(uVar9 + uVar13) < (int)uVar20) || ((int)(uVar9 + uVar20) < (int)uVar13))
                {
                  memcpy(pvVar22,pvVar14,(long)(int)uVar9);
                }
                else if (0 < (int)uVar9) {
                  uVar27 = 0;
                  do {
                    *(undefined1 *)((long)pvVar22 + uVar27) =
                         *(undefined1 *)((long)pvVar14 + uVar27);
                    uVar27 = uVar27 + 1;
                  } while (uVar9 != uVar27);
                }
                uVar6 = *(uint *)(pbVar25 + 0x350);
                uVar13 = uVar9 + uVar13 & uVar6;
                uVar20 = uVar9 + uVar20 & uVar6;
                uVar23 = uVar10 - uVar9;
                bVar5 = (int)uVar9 <= (int)uVar10;
                uVar10 = uVar23;
              } while (uVar23 != 0 && bVar5);
            }
            uVar27 = (ulong)uVar26;
            lVar15 = *(long *)(pbVar25 + 0x358) + uVar27;
          }
          else {
switchD_00576dbb_caseD_1:
            *(char *)(*(long *)(pbVar25 + 0x348) +
                     (long)(int)(*(uint *)(pbVar25 + 0x350) & *(uint *)(pbVar25 + 0x358))) =
                 (char)iVar7;
            lVar15 = *(long *)(pbVar25 + 0x358) + 1;
            uVar27 = 1;
          }
          *(long *)(pbVar25 + 0x358) = lVar15;
          uVar27 = uVar27 + *(long *)(pbVar25 + 0xb0);
          *(ulong *)(pbVar25 + 0xb0) = uVar27;
        }
        uVar21 = (ulong)(uint)(*(int *)(pbVar25 + 0xd8) - *(int *)(pbVar25 + 0xd4));
        if ((long)uVar27 < (long)(ulong)(uint)(*(int *)(pbVar25 + 0xd8) - *(int *)(pbVar25 + 0xd4)))
        {
          uVar21 = uVar27;
        }
        uVar6 = copy_from_lzss_window(a,buff,*(int64_t *)(pbVar25 + 0xb8),(int)uVar21);
        if (uVar6 != 0) goto LAB_005779ca;
        *(ulong *)(pbVar25 + 0xb8) = *(long *)(pbVar25 + 0xb8) + uVar21;
        *(ulong *)(pbVar25 + 0xb0) = *(long *)(pbVar25 + 0xb0) - uVar21;
        uVar27 = 0;
LAB_00577792:
        puVar16 = (uchar *)*buff;
LAB_0057779b:
        if (puVar16 != (uchar *)0x0) {
          pbVar25[0xd4] = 0;
          pbVar25[0xd5] = 0;
          pbVar25[0xd6] = 0;
          pbVar25[0xd7] = 0;
          *size = (ulong)*(uint *)(pbVar25 + 0xd8);
          lVar15 = *(long *)(pbVar25 + 0xc0);
          *offset = lVar15;
          *(size_t *)(pbVar25 + 0xc0) = lVar15 + *size;
          uVar17 = cm_zlib_crc32(*(unsigned_long *)(pbVar25 + 0xf0),puVar16,(uint)*size);
          *(uLong *)(pbVar25 + 0xf0) = uVar17;
LAB_005779cd:
          iVar7 = (int)uVar27;
          if (iVar7 == -0x14) {
            return -0x14;
          }
          if (iVar7 == 0) {
            return 0;
          }
LAB_005778b9:
          Ppmd7_Free((CPpmd7 *)((long)pvVar4 + 0x398),&g_szalloc);
          return iVar7;
        }
      } while( true );
    }
    if (*(byte *)((long)pvVar4 + 0x17) == 0x30) {
      pbVar25 = (byte *)a->format->data;
      if ((*(long *)(pbVar25 + 0xa8) == 0) && (((*pbVar25 & 1) == 0 || ((pbVar25[0x18] & 2) == 0))))
      {
        *buff = (void *)0x0;
        *size = 0;
        *offset = *(int64_t *)(pbVar25 + 0xb8);
        if (*(long *)(pbVar25 + 8) == *(long *)(pbVar25 + 0xf0)) {
          pbVar25[0xed] = 1;
          goto LAB_005777e6;
        }
        pcVar19 = "File CRC error";
      }
      else {
        puVar16 = (uchar *)rar_read_ahead(a,1,(ssize_t *)&local_38);
        *buff = puVar16;
        if (0 < (long)local_38) {
          *size = local_38;
          lVar15 = *(long *)(pbVar25 + 0xb8);
          *offset = lVar15;
          *(size_t *)(pbVar25 + 0xb8) = lVar15 + local_38;
          *(size_t *)(pbVar25 + 200) = *(long *)(pbVar25 + 200) + local_38;
          *(size_t *)(pbVar25 + 0xa8) = *(long *)(pbVar25 + 0xa8) - local_38;
          *(size_t *)(pbVar25 + 0xa0) = local_38;
          crc = *(unsigned_long *)(pbVar25 + 0xf0);
LAB_00577881:
          uVar17 = cm_zlib_crc32(crc,puVar16,(uint)local_38);
          *(uLong *)(pbVar25 + 0xf0) = uVar17;
          return 0;
        }
        pcVar19 = "Truncated RAR file data";
      }
    }
    else {
      pcVar19 = "Unsupported compression method for RAR file.";
    }
    archive_set_error(&a->archive,0x54,pcVar19);
    iVar7 = -0x1e;
  }
  else {
    *size = 0;
    lVar15 = *(long *)((long)pvVar4 + 0xb8);
    *offset = lVar15;
    lVar24 = *(long *)((long)pvVar4 + 0x28);
    if (*(long *)((long)pvVar4 + 0x28) < lVar15) {
      lVar24 = lVar15;
    }
    *offset = lVar24;
LAB_005777e6:
    iVar7 = 1;
  }
  return iVar7;
LAB_0057712a:
  iVar7 = *(int *)((long)pvVar14 + 0x364);
  if (iVar7 == 0) goto LAB_00576ed3;
  iVar8 = *(int *)((long)pvVar14 + 0x368);
LAB_0057743b:
  *(int *)((long)pvVar14 + 0x368) = iVar8;
  *(int *)((long)pvVar14 + 0x364) = iVar7;
  *(undefined1 *)((long)pvVar14 + 0x360) = 1;
  goto LAB_00576ed3;
switchD_00576dbb_caseD_0:
  pbVar25[0x390] = 1;
  goto LAB_00576ca4;
}

Assistant:

static int
archive_read_format_rar_read_data(struct archive_read *a, const void **buff,
                                  size_t *size, int64_t *offset)
{
  struct rar *rar = (struct rar *)(a->format->data);
  int ret;

  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  if (rar->bytes_unconsumed > 0) {
      /* Consume as much as the decompressor actually used. */
      __archive_read_consume(a, rar->bytes_unconsumed);
      rar->bytes_unconsumed = 0;
  }

  *buff = NULL;
  if (rar->entry_eof || rar->offset_seek >= rar->unp_size) {
    *size = 0;
    *offset = rar->offset;
    if (*offset < rar->unp_size)
      *offset = rar->unp_size;
    return (ARCHIVE_EOF);
  }

  switch (rar->compression_method)
  {
  case COMPRESS_METHOD_STORE:
    ret = read_data_stored(a, buff, size, offset);
    break;

  case COMPRESS_METHOD_FASTEST:
  case COMPRESS_METHOD_FAST:
  case COMPRESS_METHOD_NORMAL:
  case COMPRESS_METHOD_GOOD:
  case COMPRESS_METHOD_BEST:
    ret = read_data_compressed(a, buff, size, offset);
    if (ret != ARCHIVE_OK && ret != ARCHIVE_WARN)
      __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unsupported compression method for RAR file.");
    ret = ARCHIVE_FATAL;
    break;
  }
  return (ret);
}